

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateArgsortLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  uint uVar3;
  ActivationLinear *pAVar4;
  NeuralNetworkLayer *pNVar5;
  uint uVar6;
  bool bVar7;
  LayerUnion LVar8;
  LogMessage *other;
  long *plVar9;
  undefined8 *puVar10;
  uint uVar11;
  size_type *psVar12;
  ActivationLinear *pAVar13;
  long *plVar14;
  ulong *puVar15;
  ulong uVar16;
  undefined8 uVar17;
  _Alloc_hider _Var18;
  uint uVar19;
  uint uVar20;
  ActivationLinear *__val;
  Result r;
  string err;
  string err_1;
  string __str;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1b8;
  _Alloc_hider local_1b0;
  size_type local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  undefined1 local_190 [8];
  _Alloc_hider local_188;
  undefined1 local_180 [40];
  NeuralNetworkLayer *local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  long *local_130 [2];
  long local_120 [2];
  ulong *local_110;
  long local_108;
  ulong local_100;
  long lStack_f8;
  long *local_f0;
  undefined8 local_e8;
  long local_e0;
  undefined8 uStack_d8;
  ulong *local_d0;
  long local_c8;
  ulong local_c0 [2];
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  
  Result::Result((Result *)&local_1b8);
  validateInputCount((Result *)local_190,layer,1,1);
  local_1b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190;
  std::__cxx11::string::operator=((string *)&local_1b0,(string *)&local_188);
  bVar7 = Result::good((Result *)&local_1b8);
  pcVar2 = local_180 + 8;
  if (local_188._M_p != pcVar2) {
    operator_delete(local_188._M_p,local_180._8_8_ + 1);
  }
  if (bVar7) {
    local_158 = layer;
    validateOutputCount((Result *)local_190,layer,1,1);
    local_1b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_190;
    std::__cxx11::string::operator=((string *)&local_1b0,(string *)&local_188);
    bVar7 = Result::good((Result *)&local_1b8);
    if (local_188._M_p != pcVar2) {
      operator_delete(local_188._M_p,local_180._8_8_ + 1);
    }
    if (bVar7) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Argsort","");
      validateInputOutputRankEquality((Result *)local_190,local_158,&local_50,&this->blobNameToRank)
      ;
      local_1b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_190;
      std::__cxx11::string::operator=((string *)&local_1b0,(string *)&local_188);
      bVar7 = Result::good((Result *)&local_1b8);
      if (local_188._M_p != pcVar2) {
        operator_delete(local_188._M_p,local_180._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      pNVar5 = local_158;
      if (bVar7) {
        if (local_158->_oneof_case_[0] == 0x5b5) {
          LVar8 = local_158->layer_;
        }
        else {
          LVar8.argsort_ = Specification::ArgSortLayerParams::default_instance();
        }
        if ((long)((LVar8.activation_)->NonlinearityType_).linear_ < 0) {
          std::operator+(&local_150,
                         "Value of \'axis\' is negative for layer of type \'ArgSort\' and name \'",
                         (pNVar5->name_).ptr_);
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_150);
          psVar12 = (size_type *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_180._0_8_ = *psVar12;
            local_180._8_8_ = plVar9[3];
            local_190 = (undefined1  [8])local_180;
          }
          else {
            local_180._0_8_ = *psVar12;
            local_190 = (undefined1  [8])*plVar9;
          }
          local_188._M_p = (pointer)plVar9[1];
          *plVar9 = (long)psVar12;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
            operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
          }
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_190);
          uVar17 = local_180._0_8_;
          _Var18._M_p = (pointer)local_190;
          if (local_190 == (undefined1  [8])local_180) goto LAB_0055b727;
LAB_0055bd37:
          operator_delete(_Var18._M_p,uVar17 + 1);
          goto LAB_0055b727;
        }
        if (0 < (pNVar5->inputtensor_).super_RepeatedPtrFieldBase.current_size_) {
          if ((pNVar5->inputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1) {
            google::protobuf::internal::LogMessage::LogMessage
                      ((LogMessage *)local_190,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                       ,0x5ca);
            other = google::protobuf::internal::LogMessage::operator<<
                              ((LogMessage *)local_190,"CHECK failed: (index) < (current_size_): ");
            google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_150,other);
            google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_190);
          }
          uVar3 = *(uint *)((long)((pNVar5->inputtensor_).super_RepeatedPtrFieldBase.rep_)->elements
                                  [0] + 0x24);
          if (((long)((LVar8.activation_)->NonlinearityType_).linear_ < 0) ||
             ((long)(int)uVar3 <= (long)((LVar8.activation_)->NonlinearityType_).linear_)) {
            pAVar4 = ((LVar8.activation_)->NonlinearityType_).linear_;
            __val = (ActivationLinear *)-(long)pAVar4;
            if (0 < (long)pAVar4) {
              __val = pAVar4;
            }
            uVar20 = 1;
            if ((ActivationLinear *)0x9 < __val) {
              pAVar13 = __val;
              uVar19 = 4;
              do {
                uVar20 = uVar19;
                if (pAVar13 < (ActivationLinear *)0x64) {
                  uVar20 = uVar20 - 2;
                  goto LAB_0055b88a;
                }
                if (pAVar13 < (ActivationLinear *)0x3e8) {
                  uVar20 = uVar20 - 1;
                  goto LAB_0055b88a;
                }
                if (pAVar13 < (ActivationLinear *)0x2710) goto LAB_0055b88a;
                bVar7 = (ActivationLinear *)0x1869f < pAVar13;
                pAVar13 = (ActivationLinear *)((ulong)pAVar13 / 10000);
                uVar19 = uVar20 + 4;
              } while (bVar7);
              uVar20 = uVar20 + 1;
            }
LAB_0055b88a:
            local_130[0] = local_120;
            std::__cxx11::string::_M_construct
                      ((ulong)local_130,(char)uVar20 - (char)((long)pAVar4 >> 0x3f));
            std::__detail::__to_chars_10_impl<unsigned_long>
                      ((char *)((long)local_130[0] - ((long)pAVar4 >> 0x3f)),uVar20,
                       (unsigned_long)__val);
            plVar9 = (long *)std::__cxx11::string::replace((ulong)local_130,0,(char *)0x0,0x6306b6);
            local_b0 = &local_a0;
            plVar14 = plVar9 + 2;
            if ((long *)*plVar9 == plVar14) {
              local_a0 = *plVar14;
              lStack_98 = plVar9[3];
            }
            else {
              local_a0 = *plVar14;
              local_b0 = (long *)*plVar9;
            }
            local_a8 = plVar9[1];
            *plVar9 = (long)plVar14;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_b0);
            local_110 = &local_100;
            puVar15 = (ulong *)(plVar9 + 2);
            if ((ulong *)*plVar9 == puVar15) {
              local_100 = *puVar15;
              lStack_f8 = plVar9[3];
            }
            else {
              local_100 = *puVar15;
              local_110 = (ulong *)*plVar9;
            }
            local_108 = plVar9[1];
            *plVar9 = (long)puVar15;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            uVar20 = -uVar3;
            if (0 < (int)uVar3) {
              uVar20 = uVar3;
            }
            uVar19 = 1;
            if (9 < uVar20) {
              uVar16 = (ulong)uVar20;
              uVar6 = 4;
              do {
                uVar19 = uVar6;
                uVar11 = (uint)uVar16;
                if (uVar11 < 100) {
                  uVar19 = uVar19 - 2;
                  goto LAB_0055b9f5;
                }
                if (uVar11 < 1000) {
                  uVar19 = uVar19 - 1;
                  goto LAB_0055b9f5;
                }
                if (uVar11 < 10000) goto LAB_0055b9f5;
                uVar16 = uVar16 / 10000;
                uVar6 = uVar19 + 4;
              } while (99999 < uVar11);
              uVar19 = uVar19 + 1;
            }
LAB_0055b9f5:
            local_d0 = local_c0;
            std::__cxx11::string::_M_construct
                      ((ulong)&local_d0,(char)uVar19 - (char)((int)uVar3 >> 0x1f));
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)((ulong)(uVar3 >> 0x1f) + (long)local_d0),uVar19,uVar20);
            uVar16 = 0xf;
            if (local_110 != &local_100) {
              uVar16 = local_100;
            }
            if (uVar16 < (ulong)(local_c8 + local_108)) {
              uVar16 = 0xf;
              if (local_d0 != local_c0) {
                uVar16 = local_c0[0];
              }
              if (uVar16 < (ulong)(local_c8 + local_108)) goto LAB_0055ba87;
              puVar10 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_d0,0,(char *)0x0,(ulong)local_110);
            }
            else {
LAB_0055ba87:
              puVar10 = (undefined8 *)
                        std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_d0);
            }
            local_f0 = &local_e0;
            plVar9 = puVar10 + 2;
            if ((long *)*puVar10 == plVar9) {
              local_e0 = *plVar9;
              uStack_d8 = puVar10[3];
            }
            else {
              local_e0 = *plVar9;
              local_f0 = (long *)*puVar10;
            }
            local_e8 = puVar10[1];
            *puVar10 = plVar9;
            puVar10[1] = 0;
            *(undefined1 *)plVar9 = 0;
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_f0);
            plVar14 = plVar9 + 2;
            if ((long *)*plVar9 == plVar14) {
              local_80 = *plVar14;
              lStack_78 = plVar9[3];
              local_90 = &local_80;
            }
            else {
              local_80 = *plVar14;
              local_90 = (long *)*plVar9;
            }
            local_88 = plVar9[1];
            *plVar9 = (long)plVar14;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_90,
                                        (ulong)(((local_158->name_).ptr_)->_M_dataplus)._M_p);
            plVar14 = plVar9 + 2;
            if ((long *)*plVar9 == plVar14) {
              local_60 = *plVar14;
              lStack_58 = plVar9[3];
              local_70 = &local_60;
            }
            else {
              local_60 = *plVar14;
              local_70 = (long *)*plVar9;
            }
            local_68 = plVar9[1];
            *plVar9 = (long)plVar14;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_70);
            psVar12 = (size_type *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_150.field_2._M_allocated_capacity = *psVar12;
              local_150.field_2._8_8_ = plVar9[3];
              local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
            }
            else {
              local_150.field_2._M_allocated_capacity = *psVar12;
              local_150._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_150._M_string_length = plVar9[1];
            *plVar9 = (long)psVar12;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            if (local_70 != &local_60) {
              operator_delete(local_70,local_60 + 1);
            }
            if (local_90 != &local_80) {
              operator_delete(local_90,local_80 + 1);
            }
            if (local_f0 != &local_e0) {
              operator_delete(local_f0,local_e0 + 1);
            }
            if (local_d0 != local_c0) {
              operator_delete(local_d0,local_c0[0] + 1);
            }
            if (local_110 != &local_100) {
              operator_delete(local_110,local_100 + 1);
            }
            if (local_b0 != &local_a0) {
              operator_delete(local_b0,local_a0 + 1);
            }
            if (local_130[0] != local_120) {
              operator_delete(local_130[0],local_120[0] + 1);
            }
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_150);
            uVar17 = local_150.field_2._M_allocated_capacity;
            _Var18._M_p = local_150._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p == &local_150.field_2) goto LAB_0055b727;
            goto LAB_0055bd37;
          }
        }
      }
    }
  }
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)__return_storage_ptr__ = local_1b8;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_p == &local_1a0) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_1a0._M_allocated_capacity._1_7_,local_1a0._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_1a0._8_8_;
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_1b0._M_p;
    (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
         CONCAT71(local_1a0._M_allocated_capacity._1_7_,local_1a0._M_local_buf[0]);
  }
  (__return_storage_ptr__->m_message)._M_string_length = local_1a8;
  local_1a8 = 0;
  local_1a0._M_local_buf[0] = '\0';
  local_1b0._M_p = (pointer)&local_1a0;
LAB_0055b727:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_p != &local_1a0) {
    operator_delete(local_1b0._M_p,
                    CONCAT71(local_1a0._M_allocated_capacity._1_7_,local_1a0._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateArgsortLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    if (!(r = validateInputCount(layer, 1, 1)).good()) return r;
    if (!(r = validateOutputCount(layer, 1, 1)).good()) return r;
    if (!(r = validateInputOutputRankEquality(layer, "Argsort", blobNameToRank)).good()) return r;

    const auto& params = layer.argsort();

    if (params.axis() < 0) {
        const std::string err = "Value of 'axis' is negative for layer of type 'ArgSort' and name '" + layer.name() + "', which is not supported. It must be positive.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    if (layer.inputtensor_size() > 0) {
        const int rank = static_cast<int>(layer.inputtensor(0).rank());
        if (params.axis() < 0 || params.axis() >= rank) {
            const std::string err = "Value of 'axis' is " + std::to_string(params.axis()) + \
                                    ", but it must be in the range [0," \
                                    + std::to_string(rank) + ") for layer of type 'ArgSort' and name '" + layer.name() + "'.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    return r;
}